

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void cmExtraEclipseCDT4Generator::AppendLinkedResource
               (cmGeneratedFileStream *fout,string *name,string *path,LinkType linkType)

{
  ostream *poVar1;
  string local_88;
  string local_58;
  char *local_38;
  char *typeTag;
  char *locationTag;
  string *psStack_20;
  LinkType linkType_local;
  string *path_local;
  string *name_local;
  cmGeneratedFileStream *fout_local;
  
  typeTag = "location";
  local_38 = "2";
  if (linkType == VirtualFolder) {
    typeTag = "locationURI";
  }
  if (linkType == LinkToFile) {
    local_38 = "1";
  }
  locationTag._4_4_ = linkType;
  psStack_20 = path;
  path_local = name;
  name_local = (string *)fout;
  poVar1 = std::operator<<((ostream *)fout,"\t\t<link>\n\t\t\t<name>");
  EscapeForXML(&local_58,path_local);
  poVar1 = std::operator<<(poVar1,(string *)&local_58);
  poVar1 = std::operator<<(poVar1,"</name>\n\t\t\t<type>");
  poVar1 = std::operator<<(poVar1,local_38);
  poVar1 = std::operator<<(poVar1,"</type>\n\t\t\t<");
  poVar1 = std::operator<<(poVar1,typeTag);
  poVar1 = std::operator<<(poVar1,">");
  EscapeForXML(&local_88,psStack_20);
  poVar1 = std::operator<<(poVar1,(string *)&local_88);
  poVar1 = std::operator<<(poVar1,"</");
  poVar1 = std::operator<<(poVar1,typeTag);
  std::operator<<(poVar1,">\n\t\t</link>\n");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator
::AppendLinkedResource (cmGeneratedFileStream& fout,
                        const std::string&     name,
                        const std::string&     path,
                        LinkType linkType)
{
  const char* locationTag = "location";
  const char* typeTag = "2";
  if (linkType == VirtualFolder) // ... and not a linked folder
    {
    locationTag = "locationURI";
    }
  if (linkType == LinkToFile)
    {
    typeTag = "1";
    }

  fout <<
    "\t\t<link>\n"
    "\t\t\t<name>"
    << cmExtraEclipseCDT4Generator::EscapeForXML(name)
    << "</name>\n"
    "\t\t\t<type>" << typeTag << "</type>\n"
    "\t\t\t<" << locationTag << ">"
    << cmExtraEclipseCDT4Generator::EscapeForXML(path)
    << "</" << locationTag << ">\n"
    "\t\t</link>\n"
    ;
}